

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstackedwidget.cpp
# Opt level: O0

void __thiscall QStackedWidget::setCurrentWidget(QStackedWidget *this,QWidget *widget)

{
  int iVar1;
  QStackedWidgetPrivate *widget_00;
  QStackedLayout *in_RSI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QStackedWidgetPrivate *d;
  char *in_stack_ffffffffffffffb8;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  widget_00 = d_func((QStackedWidget *)0x6a1d6a);
  iVar1 = (**(code **)(*(long *)&widget_00->layout->super_QLayout + 0xb8))(widget_00->layout,in_RSI)
  ;
  if (iVar1 == -1) {
    QMessageLogger::QMessageLogger
              (in_RDI,(char *)in_RSI,(int)((ulong)widget_00 >> 0x20),in_stack_ffffffffffffffb8);
    QMessageLogger::warning
              (local_28,"QStackedWidget::setCurrentWidget: widget %p not contained in stack",in_RSI)
    ;
  }
  else {
    QStackedLayout::setCurrentWidget(in_RSI,(QWidget *)widget_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStackedWidget::setCurrentWidget(QWidget *widget)
{
    Q_D(QStackedWidget);
    if (Q_UNLIKELY(d->layout->indexOf(widget) == -1)) {
        qWarning("QStackedWidget::setCurrentWidget: widget %p not contained in stack", widget);
        return;
    }
    d->layout->setCurrentWidget(widget);
}